

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

void Scl_LibertyReadWireLoadSelect(Scl_Tree_t *p,Vec_Str_t *vOut)

{
  int iVar1;
  Scl_Item_t *pRoot;
  char *pcVar2;
  Scl_Item_t *pSVar3;
  size_t sVar4;
  int *piVar5;
  double dVar6;
  double dVar7;
  
  iVar1 = Scl_LibertyItemNum(p,p->pItems,"wire_load_selection");
  Vec_StrPutI_(vOut,iVar1);
  piVar5 = &p->pItems->Child;
  do {
    pRoot = Scl_LibertyItem(p,*piVar5);
    if (pRoot == (Scl_Item_t *)0x0) {
      return;
    }
    iVar1 = Scl_LibertyCompare(p,pRoot->Key,"wire_load_selection");
    if (iVar1 == 0) {
      pcVar2 = Scl_LibertyReadString(p,pRoot->Head);
      Vec_StrPutS_(vOut,pcVar2);
      iVar1 = Scl_LibertyItemNum(p,pRoot,"wire_load_from_area");
      Vec_StrPutI_(vOut,iVar1);
      piVar5 = &pRoot->Child;
      while( true ) {
        pSVar3 = Scl_LibertyItem(p,*piVar5);
        if (pSVar3 == (Scl_Item_t *)0x0) break;
        iVar1 = Scl_LibertyCompare(p,pSVar3->Key,"wire_load_from_area");
        if (iVar1 == 0) {
          pcVar2 = Scl_LibertyReadString(p,pSVar3->Head);
          pcVar2 = strtok(pcVar2," ,");
          dVar6 = atof(pcVar2);
          pcVar2 = strtok((char *)0x0," ,");
          dVar7 = atof(pcVar2);
          pcVar2 = strtok((char *)0x0," ");
          if (*pcVar2 == '\"') {
            sVar4 = strlen(pcVar2);
            if (pcVar2[sVar4 - 1] != '\"') {
              __assert_fail("pThird[strlen(pThird)-1] == \'\\\"\'",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                            ,0x3a3,"void Scl_LibertyReadWireLoadSelect(Scl_Tree_t *, Vec_Str_t *)");
            }
            pcVar2[sVar4 - 1] = '\0';
            pcVar2 = pcVar2 + 1;
          }
          Vec_StrPutF_(vOut,(float)dVar6);
          Vec_StrPutF_(vOut,(float)dVar7);
          Vec_StrPutS_(vOut,pcVar2);
        }
        piVar5 = &pSVar3->Next;
      }
    }
    piVar5 = &pRoot->Next;
  } while( true );
}

Assistant:

void Scl_LibertyReadWireLoadSelect( Scl_Tree_t * p, Vec_Str_t * vOut )
{
    Scl_Item_t * pItem, * pChild;
    Vec_StrPutI_( vOut, Scl_LibertyItemNum(p, Scl_LibertyRoot(p), "wire_load_selection") );
    Vec_StrPut_( vOut );
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pItem, "wire_load_selection" )
    {
        Vec_StrPutS_( vOut, Scl_LibertyReadString(p, pItem->Head) );
        Vec_StrPut_( vOut );
        Vec_StrPutI_( vOut, Scl_LibertyItemNum(p, pItem, "wire_load_from_area") );
        Vec_StrPut_( vOut );
        Scl_ItemForEachChildName( p, pItem, pChild, "wire_load_from_area" )
        {
            char * pHead  = Scl_LibertyReadString(p, pChild->Head);
            float  First  = atof( strtok(pHead, " ,") );
            float  Second = atof( strtok(NULL, " ,") );
            char * pThird = strtok(NULL, " ");
            if ( pThird[0] == '\"' )
                assert(pThird[strlen(pThird)-1] == '\"'), pThird[strlen(pThird)-1] = 0, pThird++;
            Vec_StrPutF_( vOut, First );
            Vec_StrPutF_( vOut, Second );
            Vec_StrPutS_( vOut, pThird );
            Vec_StrPut_( vOut );
        }
        Vec_StrPut_( vOut );
    }
    Vec_StrPut_( vOut );
}